

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

Scope * __thiscall TypeSpacebase::getMap(TypeSpacebase *this)

{
  Funcdata *pFVar1;
  ScopeLocal *this_00;
  
  this_00 = (ScopeLocal *)this->glb->symboltab->globalscope;
  if ((this->localframe).base != (AddrSpace *)0x0) {
    pFVar1 = Scope::queryFunction((Scope *)this_00,&this->localframe);
    if (pFVar1 != (Funcdata *)0x0) {
      this_00 = pFVar1->localmap;
    }
  }
  return (Scope *)this_00;
}

Assistant:

Scope *TypeSpacebase::getMap(void) const

{
  Scope *res = glb->symboltab->getGlobalScope();
  if (!localframe.isInvalid()) { // If this spacebase is for a localframe
    Funcdata *fd = res->queryFunction(localframe);
    if (fd != (Funcdata *)0)
      res = fd->getScopeLocal();
  }
  return res;
}